

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StickyAtomTypesSectionParser.cpp
# Opt level: O0

void __thiscall
OpenMD::StickyAtomTypesSectionParser::StickyAtomTypesSectionParser
          (StickyAtomTypesSectionParser *this,ForceFieldOptions *options)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  SectionParser *this_00;
  allocator<char> local_31;
  string local_30 [16];
  allocator<char> *in_stack_ffffffffffffffe0;
  undefined8 in_stack_ffffffffffffffe8;
  
  SectionParser::SectionParser((SectionParser *)0x28923c);
  *(undefined ***)in_RDI = &PTR__StickyAtomTypesSectionParser_00483d58;
  in_RDI[1]._M_string_length = (size_type)in_RSI;
  this_00 = (SectionParser *)&local_31;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_RSI,(char *)in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  SectionParser::setSectionName(this_00,in_RDI);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  return;
}

Assistant:

StickyAtomTypesSectionParser::StickyAtomTypesSectionParser(
      ForceFieldOptions& options) :
      options_(options) {
    setSectionName("StickyAtomTypes");
  }